

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O0

void Abc_ConvertHopToGia_rec1(Gia_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  int iLit1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDress3.c"
                  ,0x31,"void Abc_ConvertHopToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 == 0)) {
    pHVar2 = Hop_ObjFanin0(pObj);
    Abc_ConvertHopToGia_rec1(p,pHVar2);
    pHVar2 = Hop_ObjFanin1(pObj);
    Abc_ConvertHopToGia_rec1(p,pHVar2);
    iVar1 = Hop_ObjChild0CopyI(pObj);
    iLit1 = Hop_ObjChild1CopyI(pObj);
    iVar1 = Gia_ManHashAnd(p,iVar1,iLit1);
    (pObj->field_0).iData = iVar1;
    iVar1 = Hop_ObjIsMarkA(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDress3.c"
                    ,0x37,"void Abc_ConvertHopToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
    }
    Hop_ObjSetMarkA(pObj);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Converts AIG from HOP to GIA.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_ConvertHopToGia_rec1( Gia_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertHopToGia_rec1( p, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertHopToGia_rec1( p, Hop_ObjFanin1(pObj) );
    pObj->iData = Gia_ManHashAnd( p, Hop_ObjChild0CopyI(pObj), Hop_ObjChild1CopyI(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}